

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O0

void __thiscall helics::Endpoint::sendAt(Endpoint *this,char *data,size_t data_size,Time sendTime)

{
  string_view message;
  Modes MVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  
  MVar1 = Federate::getCurrentMode((Federate *)0x3ecde2);
  if (MVar1 != EXECUTING) {
    MVar1 = Federate::getCurrentMode((Federate *)0x3ecdfb);
    if (MVar1 != INITIALIZING) {
      uVar2 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffc0,in_RDI);
      message._M_str = in_stack_ffffffffffffffd0;
      message._M_len = in_stack_ffffffffffffffc8;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)in_stack_ffffffffffffffc0,message);
      __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
  }
  (**(code **)(**(long **)(in_RDI + 8) + 0x260))
            (*(long **)(in_RDI + 8),*(undefined4 *)(in_RDI + 0x10),in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

void Endpoint::sendAt(const char* data, size_t data_size, Time sendTime) const
{
    if ((fed->getCurrentMode() == Federate::Modes::EXECUTING) ||
        (fed->getCurrentMode() == Federate::Modes::INITIALIZING)) {
        mCore->sendAt(handle, data, data_size, sendTime);
    } else {
        throw(InvalidFunctionCall(
            "messages not allowed outside of execution and initialization mode"));
    }
}